

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc_json_parser.h
# Opt level: O3

uint64_t flatcc_json_parser_symbol_part(char *buf,char *end)

{
  ulong uVar1;
  
  if (7 < (ulong)((long)end - (long)buf)) {
    uVar1 = *(ulong *)buf;
    return uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
           (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
           (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  }
  uVar1 = 0;
  switch((long)end - (long)buf) {
  case 7:
    uVar1 = (long)buf[6] << 8;
  case 6:
    uVar1 = uVar1 | (long)buf[5] << 0x10;
  case 5:
    uVar1 = uVar1 | (long)buf[4] << 0x18;
  case 4:
    uVar1 = uVar1 | (long)buf[3] << 0x20;
  case 3:
    uVar1 = uVar1 | (long)buf[2] << 0x28;
  case 2:
    uVar1 = uVar1 | (long)buf[1] << 0x30;
  case 1:
    return uVar1 | (ulong)(byte)*buf << 0x38;
  default:
    return 0;
  }
}

Assistant:

static inline uint64_t flatcc_json_parser_symbol_part(const char *buf, const char *end)
{
    size_t n = (size_t)(end - buf);

#if FLATCC_ALLOW_UNALIGNED_ACCESS
    if (n >= 8) {
        return be64toh(*(uint64_t *)buf);
    }
#endif
    return flatcc_json_parser_symbol_part_ext(buf, end);
}